

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExpNoAST
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  tokens tVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArenaAllocator *pAVar5;
  PageAllocator *pageAllocator;
  undefined1 local_98 [8];
  ArenaAllocator alloc;
  tokens tk;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  tVar1 = this->m_ptoken->tk;
  if (tVar1 == tkAsgDiv) {
    if (this->m_currentCharacter != this->m_pchMinTok + 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x310,"(m_currentCharacter == m_pchMinTok + 2)",
                         "m_currentCharacter == m_pchMinTok + 2");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else if (tVar1 == tkDiv) {
    if (this->m_currentCharacter != this->m_pchMinTok + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x30d,"(m_currentCharacter == m_pchMinTok + 1)",
                         "m_currentCharacter == m_pchMinTok + 1");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x313,"(0)","Who is calling RescanRegExpNoParseTree?");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->m_currentCharacter = this->m_pchMinTok;
  if (*this->m_currentCharacter == '/') {
    this->m_currentCharacter = this->m_currentCharacter + 1;
    alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList._4_4_ =
         0;
    pAVar5 = Parser::GetAllocator(this->m_parser);
    pageAllocator =
         Memory::ArenaData::GetPageAllocator
                   (&(pAVar5->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                     super_ArenaData);
    pAVar5 = Parser::GetAllocator(this->m_parser);
    Memory::ArenaAllocator::ArenaAllocator
              ((ArenaAllocator *)local_98,L"RescanRegExp",pageAllocator,
               (pAVar5->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
               super_Allocator.outOfMemoryFunc,JsUtil::ExternalApi::RecoverUnusedMemory);
    alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList._4_4_ =
         ScanRegExpConstantNoAST(this,(ArenaAllocator *)local_98);
    Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)local_98);
    return alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
           _4_4_;
  }
  Error(this,-0x7ff5fc0c);
}

Assistant:

tokens Scanner<EncodingPolicy>::RescanRegExpNoAST()
{
#if DEBUG
    switch (m_ptoken->tk)
    {
    case tkDiv:
        Assert(m_currentCharacter == m_pchMinTok + 1);
        break;
    case tkAsgDiv:
        Assert(m_currentCharacter == m_pchMinTok + 2);
        break;
    default:
        AssertMsg(FALSE, "Who is calling RescanRegExpNoParseTree?");
        break;
    }
#endif //DEBUG

    m_currentCharacter = m_pchMinTok;
    if (*m_currentCharacter != '/')
        Error(ERRnoSlash);
    m_currentCharacter++;

    tokens tk = tkNone;

    {
        ArenaAllocator alloc(_u("RescanRegExp"), m_parser->GetAllocator()->GetPageAllocator(), m_parser->GetAllocator()->outOfMemoryFunc);
        {
            tk = ScanRegExpConstantNoAST(&alloc);
        }
    }

    return tk;
}